

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorWell::mouseMoveEvent(QColorWell *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  QMimeData *this_00;
  QDrag *this_01;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QPainter p;
  undefined1 *local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::mouseMoveEvent((QWidget *)this,e);
  if (this->mousePressed == true) {
    QVar5 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_58._8_8_ = QVar5.yp;
    local_58.shared = (PrivateShared *)QVar5.xp;
    QVar2 = QPointF::toPoint((QPointF *)&local_58);
    iVar3 = (this->pressPos).xp.m_i - QVar2.xp.m_i;
    iVar4 = (this->pressPos).yp.m_i - QVar2.yp.m_i;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = QApplication::startDragDistance();
    if (iVar4 < iVar3 + iVar1) {
      (**(code **)(*(long *)&(this->super_QWellArray).super_QWidget + 0x1a0))
                (this,(this->oldCurrent).xp.m_i,(this->oldCurrent).yp.m_i);
      iVar1 = (this->pressPos).yp.m_i;
      iVar3 = (this->super_QWellArray).cellh;
      iVar4 = QWellArray::columnAt(&this->super_QWellArray,(this->pressPos).xp.m_i);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QColor::QColor((QColor *)&local_68,
                     this->values[iVar4 * (this->super_QWellArray).nrows + iVar1 / iVar3]);
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      QColor::operator_cast_to_QVariant((QVariant *)&local_58,(QColor *)&local_68);
      QMimeData::setColorData((QVariant *)this_00);
      ::QVariant::~QVariant((QVariant *)&local_58);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58.data,(this->super_QWellArray).cellw,
                       (this->super_QWellArray).cellh);
      QPixmap::fill((QColor *)local_58.data);
      _p = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&p,(QPaintDevice *)local_58.data);
      iVar1 = QPixmap::width();
      iVar3 = QPixmap::height();
      QPainter::drawRect(&p,0,0,iVar1 + -1,iVar3 + -1);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,(QObject *)this);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      this->mousePressed = false;
      QDrag::exec(this_01,1);
      QPainter::~QPainter(&p);
      QPixmap::~QPixmap((QPixmap *)local_58.data);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorWell::mouseMoveEvent(QMouseEvent *e)
{
    QWellArray::mouseMoveEvent(e);
#if QT_CONFIG(draganddrop)
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        setCurrent(oldCurrent.x(), oldCurrent.y());
        int i = rowAt(pressPos.y()) + columnAt(pressPos.x()) * numRows();
        QColor col(values[i]);
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(cellWidth(), cellHeight());
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}